

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O0

void __thiscall PSBTInput::PSBTInput(PSBTInput *this)

{
  long lVar1;
  long in_FS_OFFSET;
  set<PSBTProprietary,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_>
  *in_stack_ffffffffffffff48;
  CTxOut *in_stack_ffffffffffffff68;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffff48);
  CTxOut::CTxOut(in_stack_ffffffffffffff68);
  CScript::CScript((CScript *)in_stack_ffffffffffffff48);
  CScript::CScript((CScript *)in_stack_ffffffffffffff48);
  CScript::CScript((CScript *)in_stack_ffffffffffffff48);
  CScriptWitness::CScriptWitness((CScriptWitness *)in_stack_ffffffffffffff48);
  std::
  map<CPubKey,_KeyOriginInfo,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_KeyOriginInfo>_>_>
  ::map((map<CPubKey,_KeyOriginInfo,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_KeyOriginInfo>_>_>
         *)in_stack_ffffffffffffff48);
  std::
  map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  ::map((map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
         *)in_stack_ffffffffffffff48);
  std::
  map<uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::map((map<uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         *)in_stack_ffffffffffffff48);
  std::
  map<uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::map((map<uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         *)in_stack_ffffffffffffff48);
  std::
  map<uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::map((map<uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         *)in_stack_ffffffffffffff48);
  std::
  map<uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::map((map<uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         *)in_stack_ffffffffffffff48);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff48);
  std::
  map<std::pair<XOnlyPubKey,_uint256>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::pair<XOnlyPubKey,_uint256>_>,_std::allocator<std::pair<const_std::pair<XOnlyPubKey,_uint256>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::map((map<std::pair<XOnlyPubKey,_uint256>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::pair<XOnlyPubKey,_uint256>_>,_std::allocator<std::pair<const_std::pair<XOnlyPubKey,_uint256>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         *)in_stack_ffffffffffffff48);
  std::
  map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
  ::map((map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
         *)in_stack_ffffffffffffff48);
  std::
  map<XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>_>
  ::map((map<XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>_>
         *)in_stack_ffffffffffffff48);
  XOnlyPubKey::XOnlyPubKey((XOnlyPubKey *)in_stack_ffffffffffffff48);
  uint256::uint256((uint256 *)in_stack_ffffffffffffff48);
  std::
  map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::map((map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
         *)in_stack_ffffffffffffff48);
  std::set<PSBTProprietary,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_>::set
            (in_stack_ffffffffffffff48);
  std::optional<int>::optional((optional<int> *)in_stack_ffffffffffffff48);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

PSBTInput() = default;